

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utlru_cache.hpp
# Opt level: O2

optional<unsigned_long> __thiscall
cappuccino::utlru_cache<unsigned_long,_unsigned_long,_(cappuccino::thread_safe)1>::do_find
          (utlru_cache<unsigned_long,_unsigned_long,_(cappuccino::thread_safe)1> *this,
          unsigned_long *key,time_point now,peek peek)

{
  _Storage<unsigned_long,_true> _Var1;
  long lVar2;
  _Storage<unsigned_long,_true> extraout_RAX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar3;
  element *e;
  optional<unsigned_long> oVar4;
  
  _Var1 = (_Storage<unsigned_long,_true>)
          std::
          _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  *)(this + 0x50),key);
  if ((__node_type *)_Var1._M_value != (__node_type *)0x0) {
    lVar2 = *(size_t *)(_Var1._M_value + 0x10) * 0x28;
    if ((long)now.__d.__r < *(long *)(*(long *)(this + 0x38) + lVar2)) {
      e = (element *)(*(long *)(this + 0x38) + lVar2);
      uVar3 = extraout_RDX;
      if (peek == no) {
        do_access(this,e);
        uVar3 = extraout_RDX_00;
      }
      _Var1 = (_Storage<unsigned_long,_true>)e->m_value;
      uVar3 = CONCAT71((int7)((ulong)uVar3 >> 8),1);
      goto LAB_0013fdb5;
    }
    do_erase(this,*(size_t *)(_Var1._M_value + 0x10));
    _Var1 = extraout_RAX;
  }
  uVar3 = 0;
LAB_0013fdb5:
  oVar4.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._8_8_ = uVar3;
  oVar4.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_payload._M_value = _Var1._M_value;
  return (optional<unsigned_long>)
         oVar4.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long>;
}

Assistant:

auto do_find(const key_type& key, std::chrono::steady_clock::time_point now, peek peek) -> std::optional<value_type>
    {
        auto keyed_position = m_keyed_elements.find(key);
        if (keyed_position != m_keyed_elements.end())
        {
            size_t   element_idx = keyed_position->second;
            element& e           = m_elements[element_idx];

            // Has the element TTL'ed?
            if (now < e.m_expire_time)
            {
                // Do not update items access if peeking.
                if (peek == peek::no)
                {
                    do_access(e);
                }
                return {e.m_value};
            }
            else
            {
                do_erase(element_idx);
            }
        }

        return {};
    }